

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

xmlCharEncodingHandler * htmlFindOutputEncoder(char *encoding)

{
  int iVar1;
  xmlCharEncodingHandler *pxStack_18;
  int res;
  xmlCharEncodingHandler *handler;
  char *encoding_local;
  
  pxStack_18 = (xmlCharEncodingHandler *)0x0;
  handler = (xmlCharEncodingHandler *)encoding;
  if (encoding == (char *)0x0) {
    xmlOpenCharEncodingHandler("HTML",1,&stack0xffffffffffffffe8);
  }
  else {
    iVar1 = xmlOpenCharEncodingHandler(encoding,1,&stack0xffffffffffffffe8);
    if (iVar1 != 0) {
      htmlSaveErr(0x57b,(xmlNodePtr)0x0,(char *)handler);
    }
  }
  return pxStack_18;
}

Assistant:

static xmlCharEncodingHandler *
htmlFindOutputEncoder(const char *encoding) {
    xmlCharEncodingHandler *handler = NULL;

    if (encoding != NULL) {
        int res;

        res = xmlOpenCharEncodingHandler(encoding, /* output */ 1,
                                         &handler);
        if (res != XML_ERR_OK)
            htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
    } else {
        /*
         * Fallback to HTML when the encoding is unspecified
         */
        xmlOpenCharEncodingHandler("HTML", /* output */ 1, &handler);
    }

    return(handler);
}